

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* cfd::core::HDWallet::ConvertEntropyToMnemonic
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,ByteData *entropy,string *language)

{
  bool bVar1;
  CfdException *this;
  allocator local_41;
  string local_40;
  
  bVar1 = CheckSupportedLanguages(language);
  if (bVar1) {
    WallyUtil::ConvertEntropyToMnemonic(__return_storage_ptr__,entropy,language);
    return __return_storage_ptr__;
  }
  local_40._M_dataplus._M_p = "cfdcore_hdwallet.cpp";
  local_40._M_string_length._0_4_ = 0x167;
  local_40.field_2._M_allocated_capacity = (long)"CfdConvertEntropyToMnemonic" + 3;
  logger::warn<std::__cxx11::string_const&>
            ((CfdSourceLocation *)&local_40,"Not support language passed. language=[{}]",language);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_40,"Not support language passed.",&local_41);
  CfdException::CfdException(this,kCfdIllegalArgumentError,&local_40);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<std::string> HDWallet::ConvertEntropyToMnemonic(
    const ByteData& entropy, const std::string& language) {
  if (!CheckSupportedLanguages(language)) {
    warn(
        CFD_LOG_SOURCE, "Not support language passed. language=[{}]",
        language);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Not support language passed.");
  }

  return WallyUtil::ConvertEntropyToMnemonic(entropy, language);
}